

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O0

int icu_63::double_conversion::CompareBufferWithDiyFp
              (Vector<const_char> buffer,int exponent,DiyFp diy_fp)

{
  int iVar1;
  uint64_t value;
  Vector<const_char> value_00;
  undefined1 local_460 [8];
  Bignum diy_fp_bignum;
  Bignum buffer_bignum;
  undefined1 auStack_28 [4];
  int exponent_local;
  DiyFp diy_fp_local;
  Vector<const_char> buffer_local;
  
  _auStack_28 = diy_fp.f_;
  diy_fp_local._8_8_ = buffer.start_;
  diy_fp_local.f_._0_4_ = diy_fp.e_;
  Bignum::Bignum((Bignum *)&diy_fp_bignum.used_digits_);
  Bignum::Bignum((Bignum *)local_460);
  value_00.length_ = buffer.length_;
  value_00.start_ = (char *)diy_fp_local._8_8_;
  value_00._12_4_ = 0;
  Bignum::AssignDecimalString((Bignum *)&diy_fp_bignum.used_digits_,value_00);
  value = DiyFp::f((DiyFp *)auStack_28);
  Bignum::AssignUInt64((Bignum *)local_460,value);
  if (exponent < 0) {
    Bignum::MultiplyByPowerOfTen((Bignum *)local_460,-exponent);
  }
  else {
    Bignum::MultiplyByPowerOfTen((Bignum *)&diy_fp_bignum.used_digits_,exponent);
  }
  iVar1 = DiyFp::e((DiyFp *)auStack_28);
  if (iVar1 < 1) {
    iVar1 = DiyFp::e((DiyFp *)auStack_28);
    Bignum::ShiftLeft((Bignum *)&diy_fp_bignum.used_digits_,-iVar1);
  }
  else {
    iVar1 = DiyFp::e((DiyFp *)auStack_28);
    Bignum::ShiftLeft((Bignum *)local_460,iVar1);
  }
  iVar1 = Bignum::Compare((Bignum *)&diy_fp_bignum.used_digits_,(Bignum *)local_460);
  return iVar1;
}

Assistant:

static int CompareBufferWithDiyFp(Vector<const char> buffer,
                                  int exponent,
                                  DiyFp diy_fp) {
  ASSERT(buffer.length() + exponent <= kMaxDecimalPower + 1);
  ASSERT(buffer.length() + exponent > kMinDecimalPower);
  ASSERT(buffer.length() <= kMaxSignificantDecimalDigits);
  // Make sure that the Bignum will be able to hold all our numbers.
  // Our Bignum implementation has a separate field for exponents. Shifts will
  // consume at most one bigit (< 64 bits).
  // ln(10) == 3.3219...
  ASSERT(((kMaxDecimalPower + 1) * 333 / 100) < Bignum::kMaxSignificantBits);
  Bignum buffer_bignum;
  Bignum diy_fp_bignum;
  buffer_bignum.AssignDecimalString(buffer);
  diy_fp_bignum.AssignUInt64(diy_fp.f());
  if (exponent >= 0) {
    buffer_bignum.MultiplyByPowerOfTen(exponent);
  } else {
    diy_fp_bignum.MultiplyByPowerOfTen(-exponent);
  }
  if (diy_fp.e() > 0) {
    diy_fp_bignum.ShiftLeft(diy_fp.e());
  } else {
    buffer_bignum.ShiftLeft(-diy_fp.e());
  }
  return Bignum::Compare(buffer_bignum, diy_fp_bignum);
}